

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

int32_t __thiscall
mapbox::detail::Earcut<unsigned_int>::zOrder(Earcut<unsigned_int> *this,double x_,double y_)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)(this->inv_size * (y_ - this->minY) * 32767.0);
  uVar2 = (uint)(this->inv_size * (x_ - this->minX) * 32767.0);
  uVar1 = (uVar1 << 8 | uVar1) & 0xff00ff;
  uVar2 = (uVar2 << 8 | uVar2) & 0xff00ff;
  uVar1 = (uVar1 << 4 | uVar1) & 0xf0f0f0f;
  uVar2 = (uVar2 << 4 | uVar2) & 0xf0f0f0f;
  uVar1 = (uVar1 << 2 | uVar1) & 0x33333333;
  uVar2 = (uVar2 << 2 | uVar2) & 0x33333333;
  return (uVar2 | uVar2 << 1) & 0x55555555 | (uVar1 * 2 | uVar1 << 2) & 0xaaaaaaaa;
}

Assistant:

int32_t Earcut<N>::zOrder(const double x_, const double y_) {
    // coords are transformed into non-negative 15-bit integer range
    int32_t x = static_cast<int32_t>(32767.0 * (x_ - minX) * inv_size);
    int32_t y = static_cast<int32_t>(32767.0 * (y_ - minY) * inv_size);

    x = (x | (x << 8)) & 0x00FF00FF;
    x = (x | (x << 4)) & 0x0F0F0F0F;
    x = (x | (x << 2)) & 0x33333333;
    x = (x | (x << 1)) & 0x55555555;

    y = (y | (y << 8)) & 0x00FF00FF;
    y = (y | (y << 4)) & 0x0F0F0F0F;
    y = (y | (y << 2)) & 0x33333333;
    y = (y | (y << 1)) & 0x55555555;

    return x | (y << 1);
}